

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

void __thiscall cmCTestBZR::LogParser::~LogParser(LogParser *this)

{
  ~LogParser((LogParser *)(this[-1].EmailRegex.endp + 8));
  return;
}

Assistant:

int InitializeParser() CM_OVERRIDE
  {
    int res = cmXMLParser::InitializeParser();
    if (res) {
      XML_SetUnknownEncodingHandler(static_cast<XML_Parser>(this->Parser),
                                    cmBZRXMLParserUnknownEncodingHandler,
                                    CM_NULLPTR);
    }
    return res;
  }